

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O0

bool isRemainingAllZero(Block *block,uint startIndex)

{
  uint local_1c;
  uint j;
  bool isAllZero;
  uint startIndex_local;
  Block *block_local;
  
  local_1c = startIndex;
  while( true ) {
    if (0x3f < local_1c) {
      return true;
    }
    if ((*block)[""[local_1c]] != 0) break;
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool isRemainingAllZero(const Block& block, uint startIndex) {
    bool isAllZero = true; //judge if all other pixels that follow are zero
    for(uint j = startIndex; j < 64; j++) {
        if(block[ZIG_ZAG[j]] != 0) {
            isAllZero = false;
            break;
        }
    }
    return isAllZero;
}